

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

int32_t __thiscall
llama_vocab::tokenize
          (llama_vocab *this,char *text,int32_t text_len,llama_token *tokens,int32_t n_tokens_max,
          bool add_special,bool parse_special)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  string *in_RCX;
  int in_EDX;
  char *in_RSI;
  int in_R8D;
  byte in_R9B;
  byte in_stack_00000008;
  size_t i;
  vector<int,_std::allocator<int>_> res;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff48;
  ulong local_88;
  allocator local_69;
  string local_68 [32];
  vector<int,_std::allocator<int>_> local_48;
  byte local_2e;
  byte local_2d;
  int local_2c;
  string *local_28;
  int local_4;
  
  local_2d = in_R9B & 1;
  local_2e = in_stack_00000008 & 1;
  uVar1 = (ulong)in_EDX;
  local_2c = in_R8D;
  local_28 = in_RCX;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_68,in_RSI,uVar1,&local_69);
  tokenize((llama_vocab *)CONCAT44(in_EDX,in_stack_ffffffffffffff48),in_RCX,
           SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0),
           SUB41((uint)in_stack_ffffffffffffff3c >> 0x10,0));
  ::std::__cxx11::string::~string(local_68);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
  sVar2 = ::std::vector<int,_std::allocator<int>_>::size(&local_48);
  if (local_2c < (int)sVar2) {
    sVar2 = ::std::vector<int,_std::allocator<int>_>::size(&local_48);
    local_4 = -(int)sVar2;
  }
  else {
    local_88 = 0;
    while( true ) {
      sVar2 = ::std::vector<int,_std::allocator<int>_>::size(&local_48);
      if (sVar2 <= local_88) break;
      pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[](&local_48,local_88);
      *(value_type *)(&local_28->_M_dataplus + local_88 * 4) = *pvVar3;
      local_88 = local_88 + 1;
    }
    sVar2 = ::std::vector<int,_std::allocator<int>_>::size(&local_48);
    local_4 = (int)sVar2;
  }
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)in_RCX);
  return local_4;
}

Assistant:

int32_t llama_vocab::tokenize(
                  const char * text,
                     int32_t   text_len,
                 llama_token * tokens,
                     int32_t   n_tokens_max,
                        bool   add_special,
                        bool   parse_special) const {
    auto res = tokenize(std::string(text, text_len), add_special, parse_special);
    if (n_tokens_max < (int) res.size()) {
        // LLAMA_LOG_ERROR("%s: too many tokens\n", __func__);
        return -((int) res.size());
    }

    for (size_t i = 0; i < res.size(); i++) {
        tokens[i] = res[i];
    }

    return res.size();
}